

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  undefined8 *puVar1;
  ImVec2 IVar2;
  ImDrawList *pIVar3;
  ImGuiWindow *this;
  ImFont *font;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  ImGuiWindow *pIVar18;
  ImU32 IVar19;
  uint uVar20;
  ulong uVar21;
  char *text_end;
  ImVec2 IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar28;
  undefined1 auVar27 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  ImRect IVar35;
  ImVec4 local_f8;
  ImVec2 local_e8;
  ImVec2 aIStack_e0 [2];
  ImRect *local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  ImVec2 local_98;
  undefined8 uStack_90;
  ImVec2 local_88;
  undefined8 uStack_80;
  ImVec2 *local_70;
  ImDrawList *local_68;
  ImGuiWindow *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  IVar22 = (ImVec2)GImGui;
  local_60 = GImGui->CurrentWindow;
  local_98 = bb->Min;
  uStack_90 = 0;
  _fStack_a0 = 0;
  local_a8._0_4_ = (bb->Max).x;
  local_a8._4_4_ = (bb->Max).y;
  local_88 = (viewport->super_ImGuiViewport).Pos;
  uStack_80 = 0;
  local_b8 = (viewport->super_ImGuiViewport).Size;
  uStack_b0 = 0;
  pIVar3 = local_60->DrawList;
  local_f8.x = (GImGui->Style).Colors[5].x;
  local_f8.y = (GImGui->Style).Colors[5].y;
  uVar6 = (GImGui->Style).Colors[5].z;
  uVar7 = (GImGui->Style).Colors[5].w;
  local_f8.w = (GImGui->Style).Alpha * 0.4 * (float)uVar7;
  local_f8.z = (float)uVar6;
  local_68 = draw_list;
  IVar19 = ColorConvertFloat4ToU32(&local_f8);
  local_d0 = bb;
  local_70 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar3,&bb->Min,&bb->Max,IVar19,0.0,0xf);
  uVar20 = (((ImGuiContext *)IVar22)->Windows).Size;
  if (uVar20 != 0) {
    auVar27._0_4_ = (float)local_a8._0_4_ - local_98.x;
    auVar27._4_4_ = (float)local_a8._4_4_ - local_98.y;
    auVar27._8_4_ = fStack_a0 - (float)uStack_90;
    auVar27._12_4_ = fStack_9c - uStack_90._4_4_;
    auVar17._8_8_ = uStack_b0;
    auVar17._0_4_ = local_b8.x;
    auVar17._4_4_ = local_b8.y;
    _local_a8 = divps(auVar27,auVar17);
    local_58 = local_a8._4_4_;
    local_48 = local_98.y - local_88.y * local_58;
    uVar21 = 0;
    local_b8 = IVar22;
    local_98.y = local_48;
    local_98.x = local_98.x - local_88.x * local_a8._0_4_;
    uStack_90 = CONCAT44(uStack_90._4_4_ - uStack_80._4_4_ * local_a8._12_4_,
                         (float)uStack_90 - (float)uStack_80 * local_a8._8_4_);
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    do {
      this = (*(ImGuiWindow ***)((long)IVar22 + 0x1a90))[uVar21];
      if ((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) {
        local_e8 = this->Pos;
        aIStack_e0[0].x = (this->Size).x + local_e8.x;
        aIStack_e0[0].y = (this->Size).y + local_e8.y;
        IVar35 = ImGuiWindow::TitleBarRect(this);
        pIVar18 = local_60;
        fVar32 = (float)(int)(local_e8.y * local_58 + local_48);
        fVar24 = (local_d0->Min).x;
        fVar25 = (local_d0->Min).y;
        IVar2 = local_d0->Max;
        fVar30 = (float)(int)(aIStack_e0[0].x * (float)local_a8._0_4_ + local_98.x);
        fVar31 = (float)(int)(IVar35.Min.y * (float)local_a8._4_4_ + local_98.y);
        fVar29 = fVar31 + 5.0;
        fVar26 = IVar2.x;
        fVar28 = IVar2.y;
        fVar23 = fVar25;
        if ((fVar25 <= fVar32) && (fVar23 = fVar28, fVar32 <= fVar28)) {
          fVar23 = fVar32;
        }
        fVar33 = (float)(int)(local_e8.x * (float)local_a8._0_4_ + local_98.x);
        fVar34 = (float)(int)(aIStack_e0[0].y * (float)local_a8._4_4_ + local_98.y);
        auVar5._4_4_ = -(uint)(fVar33 < fVar24);
        auVar5._0_4_ = -(uint)(fVar33 < fVar24);
        auVar5._8_4_ = -(uint)(fVar34 < fVar25);
        auVar5._12_4_ = -(uint)(fVar34 < fVar25);
        uVar20 = movmskpd((int)local_d0,auVar5);
        fVar32 = fVar24;
        if (((uVar20 & 1) == 0) && (fVar32 = fVar26, fVar33 <= fVar26)) {
          fVar32 = fVar33;
        }
        local_e8.y = fVar23;
        local_e8.x = fVar32;
        fVar23 = fVar25;
        if (((uVar20 & 2) == 0) && (fVar23 = fVar28, fVar34 <= fVar28)) {
          fVar23 = fVar34;
        }
        auVar4._4_4_ = -(uint)(fVar30 < fVar24);
        auVar4._0_4_ = -(uint)(fVar30 < fVar24);
        auVar4._8_4_ = -(uint)(fVar31 < fVar25);
        auVar4._12_4_ = -(uint)(fVar31 < fVar25);
        uVar20 = movmskpd(uVar20,auVar4);
        fVar32 = fVar24;
        if (((uVar20 & 1) == 0) && (fVar32 = fVar26, fVar30 <= fVar26)) {
          fVar32 = fVar30;
        }
        aIStack_e0[0].y = fVar23;
        aIStack_e0[0].x = fVar32;
        fVar23 = fVar25;
        if (((uVar20 & 2) == 0) && (fVar23 = fVar28, fVar31 <= fVar28)) {
          fVar23 = fVar31;
        }
        fVar31 = (float)(int)(IVar35.Min.x * (float)local_a8._0_4_ + local_98.x);
        fVar30 = fVar26;
        if (fVar31 <= fVar26) {
          fVar30 = fVar31;
        }
        local_c8.x = (float)(-(uint)(fVar31 < fVar24) & (uint)fVar24 |
                            ~-(uint)(fVar31 < fVar24) & (uint)fVar30);
        local_c8.y = fVar23;
        if ((fVar25 <= fVar29) && (fVar25 = fVar28, fVar29 <= fVar28)) {
          fVar25 = fVar29;
        }
        fVar23 = (float)(int)(IVar35.Max.x * (float)local_a8._0_4_ + local_98.x);
        if (fVar23 <= fVar26) {
          IVar2.y = 0.0;
          IVar2.x = fVar23;
        }
        local_c0.x = (float)(-(uint)(fVar23 < fVar24) & (uint)fVar24 |
                            ~-(uint)(fVar23 < fVar24) & (uint)IVar2.x);
        local_c0.y = fVar25;
        if (*(ImGuiWindow **)((long)IVar22 + 0x1ca0) == (ImGuiWindow *)0x0) {
          uVar20 = 10;
        }
        else {
          uVar20 = this->RootWindowForTitleBarHighlight ==
                   (*(ImGuiWindow **)((long)IVar22 + 0x1ca0))->RootWindowForTitleBarHighlight | 10;
        }
        pIVar3 = local_60->DrawList;
        local_f8.x = (GImGui->Style).Colors[2].x;
        local_f8.y = (GImGui->Style).Colors[2].y;
        uVar8 = (GImGui->Style).Colors[2].z;
        uVar9 = (GImGui->Style).Colors[2].w;
        local_f8.w = (GImGui->Style).Alpha * (float)uVar9;
        local_f8.z = (float)uVar8;
        IVar19 = ColorConvertFloat4ToU32(&local_f8);
        ImDrawList::AddRectFilled(pIVar3,&local_e8,aIStack_e0,IVar19,0.0,0xf);
        pIVar3 = pIVar18->DrawList;
        puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar20 << 4));
        local_f8._0_8_ = *puVar1;
        uVar10 = puVar1[1];
        local_f8.w = (float)((ulong)uVar10 >> 0x20);
        local_f8.z = (float)uVar10;
        local_f8.w = (GImGui->Style).Alpha * local_f8.w;
        IVar19 = ColorConvertFloat4ToU32(&local_f8);
        ImDrawList::AddRectFilled(pIVar3,&local_c8,&local_c0,IVar19,0.0,0xf);
        pIVar3 = pIVar18->DrawList;
        local_f8.x = (GImGui->Style).Colors[5].x;
        local_f8.y = (GImGui->Style).Colors[5].y;
        uVar11 = (GImGui->Style).Colors[5].z;
        uVar12 = (GImGui->Style).Colors[5].w;
        local_f8.w = (GImGui->Style).Alpha * (float)uVar12;
        local_f8.z = (float)uVar11;
        IVar19 = ColorConvertFloat4ToU32(&local_f8);
        ImDrawList::AddRect(pIVar3,&local_e8,aIStack_e0,IVar19,0.0,0xf,1.0);
        IVar22 = local_b8;
        pIVar3 = pIVar18->DrawList;
        font = *(ImFont **)((long)local_b8 + 0x1978);
        local_88.x = *(float *)((long)local_b8 + 0x1980);
        local_f8.x = (GImGui->Style).Colors[0].x;
        local_f8.y = (GImGui->Style).Colors[0].y;
        uVar13 = (GImGui->Style).Colors[0].z;
        uVar14 = (GImGui->Style).Colors[0].w;
        local_f8.w = (GImGui->Style).Alpha * (float)uVar14;
        local_f8.z = (float)uVar13;
        IVar19 = ColorConvertFloat4ToU32(&local_f8);
        for (text_end = this->Name; text_end != (char *)0xffffffffffffffff; text_end = text_end + 1)
        {
          if (*text_end == '#') {
            if (text_end[1] == '#') goto LAB_00129c5b;
          }
          else if (*text_end == '\0') goto LAB_00129c5b;
        }
        text_end = (char *)0xffffffffffffffff;
LAB_00129c5b:
        ImDrawList::AddText(pIVar3,font,local_88.x,&local_c8,IVar19,this->Name,text_end,0.0,
                            (ImVec4 *)0x0);
        uVar20 = ((ImVector<ImGuiWindow_*> *)((long)IVar22 + 0x1a88))->Size;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar20);
  }
  local_f8.x = (GImGui->Style).Colors[5].x;
  local_f8.y = (GImGui->Style).Colors[5].y;
  uVar15 = (GImGui->Style).Colors[5].z;
  uVar16 = (GImGui->Style).Colors[5].w;
  local_f8.w = (GImGui->Style).Alpha * (float)uVar16;
  local_f8.z = (float)uVar15;
  IVar19 = ColorConvertFloat4ToU32(&local_f8);
  ImDrawList::AddRect(local_68,&local_d0->Min,local_70,IVar19,0.0,0xf,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}